

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

int fy_emit_common_document_end(fy_emitter *emit)

{
  fy_document_state *pfVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  fy_emitter_cfg_flags fVar5;
  
  pfVar1 = emit->fyds;
  if (pfVar1 == (fy_document_state *)0x0) {
    iVar4 = -1;
  }
  else {
    fVar5 = emit->cfg->flags & (FYECF_DOC_END_MARK_ON|FYECF_DOC_END_MARK_OFF);
    if (emit->column != 0) {
      fy_emit_putc(emit,fyewt_linebreak,10);
      emit->flags = 3;
    }
    if ((fVar5 == FYECF_DOC_END_MARK_ON) ||
       ((bVar2 = 1, fVar5 == FYECF_DOC_END_MARK_AUTO && ((pfVar1->field_0x1c & 8) == 0)))) {
      bVar2 = (byte)((char)emit->cfg->flags & FYECF_STRIP_DOC) >> 4;
    }
    fVar5 = emit->cfg->flags;
    if ((((fVar5 & 0xe00000) == FYECF_MODE_JSON) || ((fVar5 & 0xf00000) == FYECF_MODE_JSON_ONELINE))
       || (bVar2 != 0)) {
      uVar3 = emit->flags & 0xffffffcf | 0x20;
    }
    else {
      fy_emit_puts(emit,fyewt_document_indicator,"...");
      fy_emit_putc(emit,fyewt_linebreak,10);
      uVar3 = 0x33;
    }
    emit->flags = uVar3;
    emit->fyds = (fy_document_state *)0x0;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int fy_emit_common_document_end(struct fy_emitter *emit) {
    const struct fy_document_state *fyds;
    enum fy_emitter_cfg_flags flags = emit->cfg->flags;
    enum fy_emitter_cfg_flags dem_flags = flags & FYECF_DOC_END_MARK(FYECF_DOC_END_MARK_MASK);
    bool dem;

    if (!emit || !emit->fyds)
        return -1;

    fyds = emit->fyds;

    if (emit->column != 0) {
        fy_emit_putc(emit, fyewt_linebreak, '\n');
        emit->flags = FYEF_WHITESPACE | FYEF_INDENTATION;
    }

    dem = ((dem_flags == FYECF_DOC_END_MARK_AUTO && !fyds->end_implicit) ||
           dem_flags == FYECF_DOC_END_MARK_ON) &&
          !(emit->cfg->flags & FYECF_STRIP_DOC);
    if (!fy_emit_is_json_mode(emit) && dem) {
        fy_emit_puts(emit, fyewt_document_indicator, "...");
        fy_emit_putc(emit, fyewt_linebreak, '\n');
        emit->flags = FYEF_WHITESPACE | FYEF_INDENTATION;
        emit->flags |= FYEF_HAD_DOCUMENT_END;
    } else
        emit->flags &= ~FYEF_HAD_DOCUMENT_END;

    /* mark that we did output a document earlier */
    emit->flags |= FYEF_HAD_DOCUMENT_OUTPUT;

    /* stop our association with the document */
    emit->fyds = NULL;

    return 0;
}